

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

Stmt * __thiscall kratos::Stmt::pre_stmt(Stmt *this)

{
  IRNode *pIVar1;
  _func_int *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  long lVar4;
  Stmt *pSVar5;
  shared_ptr<kratos::StmtBlock> sVar6;
  _func_int **local_28;
  pointer local_20;
  
  pIVar1 = this->parent_;
  if (((pIVar1 == (IRNode *)0x0) || (pIVar1->ast_node_type_ != StmtKind)) ||
     (*(int *)&pIVar1[1].fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 4)) {
    pSVar5 = (Stmt *)0x0;
  }
  else {
    sVar6 = as<kratos::StmtBlock>((Stmt *)&stack0xffffffffffffffd8);
    uVar3 = (**(code **)(*local_28 + 0x18))
                      (local_28,this,
                       sVar6.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
    if ((uVar3 == 0) ||
       (p_Var2 = local_28[0x18], (ulong)((long)local_28[0x19] - (long)p_Var2 >> 4) <= uVar3)) {
      pSVar5 = (Stmt *)0x0;
    }
    else {
      lVar4 = (ulong)((int)uVar3 - 1) * 0x10;
      pSVar5 = *(Stmt **)(p_Var2 + lVar4);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var2 + lVar4 + 8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (local_20 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
  }
  return pSVar5;
}

Assistant:

Stmt *Stmt::pre_stmt() const {
    if (!parent_ || parent_->ir_node_kind() != IRNodeKind::StmtKind) return nullptr;
    auto *stmt_parent = reinterpret_cast<Stmt *>(parent_);
    if (stmt_parent->type_ != StatementType::Block) return nullptr;
    auto const &block = stmt_parent->as<StmtBlock>();
    auto index = block->index_of(this);
    if (index != 0 && index < block->size()) {
        return (*block)[index - 1].get();
    }
    return nullptr;
}